

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>>::
emplaceRealloc<slang::SmallVector<slang::ast::NetAlias,2ul>>
          (SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_> *this,pointer pos,
          SmallVector<slang::ast::NetAlias,_2UL> *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pSVar4;
  long lVar5;
  pointer pSVar6;
  iterator __result;
  iterator in_RSI;
  SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  SmallVector<slang::ast::NetAlias,_2UL> *in_stack_ffffffffffffff98;
  SmallVector<slang::ast::NetAlias,_2UL> *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::max_size
                    ((SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_> *)0x93ac8b);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::calculateGrowth
                    (in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pSVar4 = SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::begin(in_RDI);
  lVar5 = (long)__last - (long)pSVar4;
  pSVar6 = (pointer)operator_new(0x93aced);
  SmallVector<slang::ast::NetAlias,_2UL>::SmallVector
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pSVar4 = SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::end(in_RDI);
  if (in_RSI == pSVar4) {
    __result = SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::begin(in_RDI);
    pSVar4 = SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::end(in_RDI);
    std::
    uninitialized_move<slang::SmallVector<slang::ast::NetAlias,2ul>*,slang::SmallVector<slang::ast::NetAlias,2ul>*>
              (in_RSI,__last,__result);
  }
  else {
    SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::begin(in_RDI);
    std::
    uninitialized_move<slang::SmallVector<slang::ast::NetAlias,2ul>*,slang::SmallVector<slang::ast::NetAlias,2ul>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    pSVar4 = SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::end(in_RDI);
    std::
    uninitialized_move<slang::SmallVector<slang::ast::NetAlias,2ul>*,slang::SmallVector<slang::ast::NetAlias,2ul>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::cleanup
            (in_RDI,(EVP_PKEY_CTX *)pSVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pSVar6;
  return pSVar6 + lVar5 / 0x58;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}